

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

CPubKey * HexToPubKey(string *hex_in)

{
  Span<const_unsigned_char> _vch;
  string_view str;
  string_view hex_str;
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  Span<const_unsigned_char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  CPubKey *pCVar5;
  string *psVar6;
  undefined1 in_stack_fffffffffffffed8 [16];
  undefined2 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  undefined1 uVar7;
  int in_stack_fffffffffffffeec;
  char *pcVar8;
  Span<const_unsigned_char> local_f0 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = in_RDI;
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb8);
  pcVar8 = _Var4._M_str;
  str._M_str = (char *)pCVar5;
  str._M_len = (size_t)in_RDI;
  bVar1 = IsHex(str);
  if (bVar1) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (in_stack_fffffffffffffe98);
    if (sVar3 != 0x42) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(in_stack_fffffffffffffe98);
      if (sVar3 != 0x82) {
        uVar7 = 1;
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x58);
        psVar6 = in_stack_fffffffffffffed8._0_8_;
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffeec,
                                        CONCAT13(in_stack_fffffffffffffeeb,
                                                 CONCAT12(uVar7,in_stack_fffffffffffffee8))),
                       in_stack_fffffffffffffed8._8_8_);
        std::operator+(__lhs,in_stack_fffffffffffffea8);
        JSONRPCError(in_stack_fffffffffffffeec,psVar6);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(__lhs,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00e49390;
      }
    }
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffeb8);
    this = local_f0;
    hex_str._M_str = in_RSI;
    hex_str._M_len = (size_t)pcVar8;
    ParseHex<unsigned_char>(hex_str);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (this,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    _vch.m_size = (size_t)in_stack_fffffffffffffeb8;
    _vch.m_data = (uchar *)in_stack_fffffffffffffeb0;
    CPubKey::CPubKey((CPubKey *)this,_vch);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    bVar1 = CPubKey::IsFullyValid((CPubKey *)in_stack_fffffffffffffeb0);
    if (bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return pCVar5;
      }
    }
    else {
      uVar2 = __cxa_allocate_exception(0x58);
      psVar6 = (string *)_Var4._M_len;
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffeec,
                                      CONCAT13(in_stack_fffffffffffffeeb,
                                               CONCAT12(in_stack_fffffffffffffeea,
                                                        in_stack_fffffffffffffee8))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var4._M_str);
      std::operator+(in_stack_fffffffffffffeb0,(char *)this);
      JSONRPCError(in_stack_fffffffffffffeec,psVar6);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    uVar7 = 1;
    uVar2 = __cxa_allocate_exception(0x58);
    psVar6 = in_stack_fffffffffffffed8._0_8_;
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffeec,
                                    CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffeea,
                                                            in_stack_fffffffffffffee8))),
                   in_stack_fffffffffffffed8._8_8_);
    std::operator+(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    JSONRPCError(in_stack_fffffffffffffeec,psVar6);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_00e49390:
  __stack_chk_fail();
}

Assistant:

CPubKey HexToPubKey(const std::string& hex_in)
{
    if (!IsHex(hex_in)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must be a hex string");
    }
    if (hex_in.length() != 66 && hex_in.length() != 130) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must have a length of either 33 or 65 bytes");
    }
    CPubKey vchPubKey(ParseHex(hex_in));
    if (!vchPubKey.IsFullyValid()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must be cryptographically valid.");
    }
    return vchPubKey;
}